

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O2

void wostringstream_suite::test_view(void)

{
  __type v;
  void *__buf;
  undefined1 local_1d1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1d0;
  wstring input;
  ostream_buffer<wchar_t,_trial::protocol::buffer::basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>_>
  container;
  wostringstream output;
  int aiStack_160 [86];
  
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&output);
  container.
  super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>.
  super_base<wchar_t>._vptr_base = (_func_int **)&PTR__base_00106d20;
  container.
  super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>.
  content = (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&output;
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&input,L"alpha",(allocator<wchar_t> *)&local_1d0);
  local_1d0._M_dataplus._M_p._0_1_ = *(int *)((long)aiStack_160 + *(long *)(_output + -0x18)) == 0;
  local_1d1 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x78,"void wostringstream_suite::test_view()",&local_1d0,&local_1d1);
  local_1d0._M_dataplus._M_p = (pointer)input._M_string_length;
  local_1d0._M_string_length = (size_type)input._M_dataplus._M_p;
  trial::protocol::buffer::
  basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>::write
            (&container.
              super_basic_ostream<wchar_t,_std::char_traits<wchar_t>,_trial::protocol::buffer::base<wchar_t>_>
             ,(int)&local_1d0,__buf,input._M_string_length);
  std::__cxx11::wstringbuf::str();
  v = std::operator==(&local_1d0,&input);
  boost::detail::test_impl
            ("output.str() == input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x7a,"void wostringstream_suite::test_view()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_1d0);
  std::__cxx11::wstring::~wstring((wstring *)&input);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&output);
  return;
}

Assistant:

void test_view()
{
    std::wostringstream output;
    ostream_buffer<wchar_t> container(output);
    std::wstring input = L"alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));
    TRIAL_PROTOCOL_TEST(output.str() == input);
}